

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

u16 numericType(Mem *pMem)

{
  ushort uVar1;
  int iVar2;
  double dStack_18;
  
  uVar1 = pMem->flags & 0x2d;
  dStack_18 = (double)(ulong)uVar1;
  if (uVar1 != 0) {
    return uVar1;
  }
  if (((pMem->flags & 0x400) == 0) || (iVar2 = sqlite3VdbeMemExpandBlob(pMem), iVar2 == 0)) {
    iVar2 = sqlite3AtoF(pMem->z,(double *)pMem,pMem->n,pMem->enc);
    if (iVar2 < 1) {
      if (iVar2 != 0) {
        return 8;
      }
      iVar2 = sqlite3Atoi64(pMem->z,(i64 *)&dStack_18,pMem->n,pMem->enc);
      if (1 < iVar2) {
        return 8;
      }
    }
    else {
      if (iVar2 != 1) {
        return 8;
      }
      iVar2 = sqlite3Atoi64(pMem->z,(i64 *)&dStack_18,pMem->n,pMem->enc);
      if (iVar2 != 0) {
        return 8;
      }
    }
  }
  else {
    dStack_18 = 0.0;
  }
  (pMem->u).r = dStack_18;
  return 4;
}

Assistant:

static u16 numericType(Mem *pMem){
  assert( (pMem->flags & MEM_Null)==0
       || pMem->db==0 || pMem->db->mallocFailed );
  if( pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null) ){
    testcase( pMem->flags & MEM_Int );
    testcase( pMem->flags & MEM_Real );
    testcase( pMem->flags & MEM_IntReal );
    return pMem->flags & (MEM_Int|MEM_Real|MEM_IntReal|MEM_Null);
  }
  assert( pMem->flags & (MEM_Str|MEM_Blob) );
  testcase( pMem->flags & MEM_Str );
  testcase( pMem->flags & MEM_Blob );
  return computeNumericType(pMem);
  return 0;
}